

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

String * kj::_::operator*(String *__return_storage_ptr__,undefined8 *param_2,
                         ArrayPtr<const_unsigned_char> *param_3,undefined8 param_4,
                         Delimited<kj::ArrayPtr<const_unsigned_char>_> *param_5)

{
  Delimited<kj::ArrayPtr<const_unsigned_char>_> *params;
  ArrayPtr<const_unsigned_char> *value;
  Delimited<kj::ArrayPtr<const_unsigned_char>_> local_90;
  Delimited<kj::ArrayPtr<const_unsigned_char>_> local_58;
  undefined8 *local_20;
  DebugComparison<const_kj::ArrayPtr<const_unsigned_char>_&,_kj::ArrayPtr<const_unsigned_char>_>
  *cmp_local;
  String *local_10;
  
  local_20 = param_2;
  local_10 = __return_storage_ptr__;
  tryToCharSequence<kj::ArrayPtr<unsigned_char_const>const,kj::_::Delimited<kj::ArrayPtr<unsigned_char_const>>>
            (&local_58,(_ *)*param_2,param_3);
  params = (Delimited<kj::ArrayPtr<const_unsigned_char>_> *)(local_20 + 3);
  tryToCharSequence<kj::ArrayPtr<unsigned_char_const>,kj::_::Delimited<kj::ArrayPtr<unsigned_char_const>>>
            (&local_90,(_ *)(local_20 + 1),value);
  concat<kj::_::Delimited<kj::ArrayPtr<unsigned_char_const>>,kj::StringPtr&,kj::_::Delimited<kj::ArrayPtr<unsigned_char_const>>>
            (__return_storage_ptr__,(_ *)&local_58,params,(StringPtr *)&local_90,param_5);
  Delimited<kj::ArrayPtr<const_unsigned_char>_>::~Delimited(&local_90);
  Delimited<kj::ArrayPtr<const_unsigned_char>_>::~Delimited(&local_58);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}